

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::GroupedAggregateHashTable::ReinsertTuples
          (GroupedAggregateHashTable *this,PartitionedTupleData *data)

{
  pointer puVar1;
  ulong uVar2;
  bool bVar3;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar4;
  pointer this_00;
  idx_t *piVar5;
  type collection_p;
  data_ptr_t *ppdVar6;
  idx_t iVar7;
  pointer this_01;
  ulong uVar8;
  ulong uVar9;
  TupleDataChunkIterator iterator;
  TupleDataChunkIterator local_268;
  
  puVar4 = PartitionedTupleData::GetPartitions(data);
  this_01 = (puVar4->
            super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (puVar4->
           super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != puVar1) {
    do {
      this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                ::operator->(this_01);
      piVar5 = TupleDataCollection::Count(this_00);
      if (*piVar5 != 0) {
        collection_p = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                       ::operator*(this_01);
        TupleDataChunkIterator::TupleDataChunkIterator(&local_268,collection_p,ALREADY_PINNED,false)
        ;
        ppdVar6 = TupleDataChunkIterator::GetRowLocations(&local_268);
        uVar9 = 0;
        do {
          while( true ) {
            iVar7 = TupleDataChunkIterator::GetCurrentChunkCount(&local_268);
            if (iVar7 <= uVar9) break;
            uVar2 = *(ulong *)(ppdVar6[uVar9] + this->hash_offset);
            uVar8 = uVar2;
            while (uVar8 = this->bitmask & uVar8, this->entries[uVar8].value != 0) {
              uVar8 = uVar8 + 1;
            }
            this->entries[uVar8].value =
                 ((ulong)ppdVar6[uVar9] | 0xffff000000000000) & (uVar2 | 0xffffffffffff);
            uVar9 = uVar9 + 1;
          }
          bVar3 = TupleDataChunkIterator::Next(&local_268);
          uVar9 = 0;
        } while (bVar3);
        TupleDataChunkState::~TupleDataChunkState(&local_268.state.chunk_state);
        ::std::
        vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
        ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
                   *)&local_268.state.pin_state.heap_handles);
        ::std::
        vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
        ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
                   *)&local_268.state);
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  return;
}

Assistant:

void GroupedAggregateHashTable::ReinsertTuples(PartitionedTupleData &data) {
	for (auto &data_collection : data.GetPartitions()) {
		if (data_collection->Count() == 0) {
			continue;
		}
		TupleDataChunkIterator iterator(*data_collection, TupleDataPinProperties::ALREADY_PINNED, false);
		const auto row_locations = iterator.GetRowLocations();
		do {
			for (idx_t i = 0; i < iterator.GetCurrentChunkCount(); i++) {
				const auto &row_location = row_locations[i];
				const auto hash = Load<hash_t>(row_location + hash_offset);

				// Find an empty entry
				auto ht_offset = ApplyBitMask(hash);
				D_ASSERT(ht_offset == hash % capacity);
				while (entries[ht_offset].IsOccupied()) {
					IncrementAndWrap(ht_offset, bitmask);
				}
				auto &entry = entries[ht_offset];
				D_ASSERT(!entry.IsOccupied());
				entry.SetSalt(ht_entry_t::ExtractSalt(hash));
				entry.SetPointer(row_location);
				D_ASSERT(entry.IsOccupied());
			}
		} while (iterator.Next());
	}
}